

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
iu_FilePath_x_iutest_x_DirectoryExists_Test::iu_FilePath_x_iutest_x_DirectoryExists_Test
          (iu_FilePath_x_iutest_x_DirectoryExists_Test *this)

{
  iu_FilePath_x_iutest_x_DirectoryExists_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_FilePath_x_iutest_x_DirectoryExists_Test_00613e70;
  return;
}

Assistant:

IUTEST(FilePath, DirectoryExists)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_FALSE(path.DirectoryExists());
    }
#if defined(IUTEST_USE_GTEST) || IUTEST_HAS_FILE_STAT
    {
        ::iutest::internal::FilePath path = ::iutest::internal::FilePath::GetCurrentDir();
        IUTEST_EXPECT_FALSE(path.IsEmpty());
        IUTEST_EXPECT_TRUE (path.DirectoryExists());
    }
#endif
}